

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  WriteImageDataFunction *WriteImageData;
  pointer pBVar1;
  uint __val;
  uint uVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  long *plVar10;
  size_type *psVar11;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint __len;
  uint uVar12;
  pointer pcVar13;
  pointer pbVar14;
  string *value;
  bool bVar15;
  string binSavePath;
  json buffer;
  JsonDocument output;
  string binUri;
  json buffers;
  string defaultBinFileExt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  string defaultBinFilename;
  string __str;
  string baseDir;
  json images;
  bool local_3b9;
  undefined1 local_3b0 [8];
  json_value local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  uint local_38c;
  undefined1 local_388 [8];
  json_value local_380;
  undefined1 local_378 [8];
  json_value local_370;
  string *local_368;
  undefined4 local_35c;
  uint local_358;
  undefined4 local_354;
  value_type local_350;
  undefined8 local_330;
  pointer local_328;
  TinyGLTF *local_320;
  ulong local_318;
  long local_310;
  undefined1 local_308 [8];
  json_value local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  pointer local_298;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  string local_250;
  undefined1 local_230 [8];
  json_value local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_358 = (uint)CONCAT71(in_register_00000089,prettyPrint);
  local_354 = (undefined4)CONCAT71(in_register_00000081,embedBuffers);
  local_35c = (undefined4)CONCAT71(in_register_00000009,embedImages);
  local_378[0] = null;
  local_370.object = (object_t *)0x0;
  local_320 = this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_378);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_378);
  std::__cxx11::string::find_last_of((char *)filename,0x2f4327,0xffffffffffffffff);
  local_368 = filename;
  std::__cxx11::string::substr((ulong)&local_2b8,(ulong)filename);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,".bin","");
  lVar6 = std::__cxx11::string::rfind((char)&local_2b8,0x2e);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)local_230,(ulong)&local_2b8);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_230);
    if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
      operator_delete((void *)local_230);
    }
  }
  GetBaseDir(&local_250,local_368);
  if (local_250._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)0x0,0x31e0c8);
  }
  SerializeGltfModel(model,(json *)local_378);
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308[0] = null;
  local_300.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_308);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_308);
  local_3b9 = (model->buffers).
              super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (model->buffers).
              super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (!local_3b9) {
    local_328 = _VTT;
    local_330 = _recvfrom;
    uVar9 = 0;
    do {
      local_388[0] = null;
      local_380.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_388);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_388);
      if ((char)local_354 == '\0') {
        local_3b0 = (undefined1  [8])(local_3b0 + 0x10);
        local_3a8.object = (object_t *)0x0;
        local_3a0._M_local_buf[0] = '\0';
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        local_350._M_string_length = 0;
        local_350.field_2._M_local_buf[0] = '\0';
        pBVar1 = (model->buffers).
                 super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_310 = uVar9 * 0xf0;
        local_318 = uVar9;
        if ((pBVar1[uVar9].uri._M_string_length == 0) ||
           (bVar15 = IsDataURI(&pBVar1[uVar9].uri), bVar15)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_230,&local_2b8,&local_2f8);
          std::__cxx11::string::operator=((string *)&local_350,(string *)local_230);
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
            operator_delete((void *)local_230);
          }
          uVar12 = 0;
          do {
            local_298 = local_2d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            bVar15 = false;
            pbVar14 = local_2d8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                iVar4 = std::__cxx11::string::compare((string *)&local_350);
                if (iVar4 == 0) {
                  __val = -uVar12;
                  if (0 < (int)uVar12) {
                    __val = uVar12;
                  }
                  __len = 1;
                  if (9 < __val) {
                    uVar9 = (ulong)__val;
                    uVar2 = 4;
                    do {
                      __len = uVar2;
                      uVar5 = (uint)uVar9;
                      if (uVar5 < 100) {
                        __len = __len - 2;
                        goto LAB_00292121;
                      }
                      if (uVar5 < 1000) {
                        __len = __len - 1;
                        goto LAB_00292121;
                      }
                      if (uVar5 < 10000) goto LAB_00292121;
                      uVar9 = uVar9 / 10000;
                      uVar2 = __len + 4;
                    } while (99999 < uVar5);
                    __len = __len + 1;
                  }
LAB_00292121:
                  local_290[0] = local_280;
                  local_38c = uVar12;
                  std::__cxx11::string::_M_construct
                            ((ulong)local_290,(char)__len - (char)((int)uVar12 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_290[0] + (uVar12 >> 0x1f),__len,__val);
                  plVar7 = (long *)std::__cxx11::string::replace
                                             ((ulong)local_290,0,(char *)0x0,
                                              (ulong)local_2b8._M_dataplus._M_p);
                  plVar10 = plVar7 + 2;
                  if ((long *)*plVar7 == plVar10) {
                    local_260 = *plVar10;
                    lStack_258 = plVar7[3];
                    local_270 = &local_260;
                  }
                  else {
                    local_260 = *plVar10;
                    local_270 = (long *)*plVar7;
                  }
                  local_268 = plVar7[1];
                  *plVar7 = (long)plVar10;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  plVar7 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_270,(ulong)local_2f8._M_dataplus._M_p);
                  psVar11 = (size_type *)(plVar7 + 2);
                  if ((size_type *)*plVar7 == psVar11) {
                    local_220[0]._0_8_ = *psVar11;
                    local_220[0]._8_8_ = plVar7[3];
                    local_230 = (undefined1  [8])(local_230 + 0x10);
                  }
                  else {
                    local_220[0]._0_8_ = *psVar11;
                    local_230 = (undefined1  [8])*plVar7;
                  }
                  local_228 = *(json_value *)(plVar7 + 1);
                  *plVar7 = (long)psVar11;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_350,(string *)local_230);
                  if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
                    operator_delete((void *)local_230);
                  }
                  if (local_270 != &local_260) {
                    operator_delete(local_270);
                  }
                  uVar12 = local_38c;
                  if (local_290[0] != local_280) {
                    operator_delete(local_290[0]);
                  }
                  uVar12 = uVar12 + 1;
                  bVar15 = true;
                }
              } while ((iVar4 != 0) && (pbVar14 = pbVar14 + 1, pbVar14 != local_298));
            }
          } while (bVar15);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_350);
        }
        pcVar13 = local_230 + 0x10;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2d8,&local_350);
        JoinPath((string *)local_230,&local_250,&local_350);
        std::__cxx11::string::operator=((string *)local_3b0,(string *)local_230);
        lVar6 = local_310;
        if (local_230 != (undefined1  [8])pcVar13) {
          operator_delete((void *)local_230);
        }
        value = (string *)
                ((long)&(((model->buffers).
                          super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                          _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar6)
        ;
        std::ofstream::ofstream((string *)local_230,(char *)local_3b0,_S_bin);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          local_230 = (undefined1  [8])local_328;
          *(undefined8 *)(local_230 + *(long *)(local_328 + -0x18)) = local_330;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          uVar9 = local_318;
        }
        else {
          std::ostream::write((char *)local_230,(long)value[1]._M_dataplus._M_p);
          uVar9 = local_318;
          std::ofstream::close();
          local_230 = (undefined1  [8])local_328;
          *(undefined8 *)(local_230 + *(long *)(local_328 + -0x18)) = local_330;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          if (cVar3 != '\0') {
            local_220[0]._M_allocated_capacity = 0x676e654c65747962;
            local_228.number_integer = 10;
            local_220[0]._8_3_ = 0x6874;
            local_230 = (undefined1  [8])pcVar13;
            SerializeNumberProperty<unsigned_long>
                      ((string *)local_230,
                       value[1]._M_string_length - (long)value[1]._M_dataplus._M_p,(json *)local_388
                      );
            if (local_230 != (undefined1  [8])pcVar13) {
              operator_delete((void *)local_230);
            }
            local_228.number_integer = 3;
            local_220[0]._0_4_ = 0x697275;
            local_230 = (undefined1  [8])pcVar13;
            SerializeStringProperty((string *)local_230,&local_350,(json *)local_388);
            if (local_230 != (undefined1  [8])pcVar13) {
              operator_delete((void *)local_230);
            }
            if (value->_M_string_length != 0) {
              local_228.number_integer = 4;
              local_220[0]._0_5_ = 0x656d616e;
              local_230 = (undefined1  [8])pcVar13;
              SerializeStringProperty((string *)local_230,value,(json *)local_388);
              if (local_230 != (undefined1  [8])pcVar13) {
                operator_delete((void *)local_230);
              }
            }
            if (value[2].field_2._M_local_buf[8] != '\0') {
              local_228.number_integer = 6;
              local_220[0]._0_7_ = 0x736172747865;
              local_230 = (undefined1  [8])pcVar13;
              SerializeValue((string *)local_230,(Value *)((long)&value[2].field_2 + 8),
                             (json *)local_388);
              if (local_230 != (undefined1  [8])pcVar13) {
                operator_delete((void *)local_230);
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p);
        }
        if (local_3b0 != (undefined1  [8])(local_3b0 + 0x10)) {
          operator_delete((void *)local_3b0);
        }
        if (cVar3 == '\0') {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_388);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_388 + 8),local_388[0]);
          goto LAB_0029289c;
        }
      }
      else {
        SerializeGltfBuffer((model->buffers).
                            super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar9,
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_388);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_308,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_388);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_388);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_388 + 8),local_388[0]);
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar8 = ((long)(model->buffers).
                     super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(model->buffers).
                     super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
      bVar15 = uVar8 - uVar9 == 0;
      local_3b9 = uVar8 < uVar9 || bVar15;
    } while (uVar8 >= uVar9 && !bVar15);
  }
  anon_unknown_57::JsonAddMember((json *)local_378,"buffers",(json *)local_308);
  if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_230 = (undefined1  [8])((ulong)local_230 & 0xffffffffffffff00);
    local_228.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      WriteImageData = &local_320->WriteImageData;
      uVar9 = 0;
      bVar15 = local_35c._0_1_;
      do {
        local_3b0 = (undefined1  [8])((ulong)local_3b0 & 0xffffffffffffff00);
        local_3a8.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_3b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_3b0);
        UpdateImageObject((model->images).
                          super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar9,&local_250,(int)uVar9,
                          bVar15,WriteImageData,local_320->write_image_user_data_);
        SerializeGltfImage((model->images).
                           super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar9,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_3b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_230,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_3b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_3b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_3b0 + 8),(value_t)local_3b0[0]);
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar8 = ((long)(model->images).
                       super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(model->images).
                       super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5;
      } while (uVar9 <= uVar8 && uVar8 - uVar9 != 0);
    }
    anon_unknown_57::JsonAddMember((json *)local_378,"images",(json *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_230 + 8),(value_t)local_230[0]);
  }
  if (writeBinary) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_3b0,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_378,-1,' ',false,strict);
    std::ofstream::ofstream(local_230,(local_368->_M_dataplus)._M_p,_S_bin);
    WriteBinaryGltfStream((ostream *)local_230,(string *)local_3b0);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_3b0,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_378,(local_358 & 0xff) - 1 | 2,' ',false,strict);
    std::ofstream::ofstream(local_230,(local_368->_M_dataplus)._M_p,_S_out);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      WriteGltfStream((ostream *)local_230,(string *)local_3b0);
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _recvfrom;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_3b0 != (undefined1  [8])(local_3b0 + 0x10)) {
    operator_delete((void *)local_3b0);
  }
LAB_0029289c:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_308);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_308 + 8),local_308[0]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_378);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_378 + 8),local_378[0]);
  return local_3b9;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(Model *model, const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    if (embedBuffers) {
      SerializeGltfBuffer(model->buffers[i], buffer);
    } else {
      std::string binSavePath;
      std::string binUri;
      if (!model->buffers[i].uri.empty() && !IsDataURI(model->buffers[i].uri)) {
        binUri = model->buffers[i].uri;
      } else {
        binUri = defaultBinFilename + defaultBinFileExt;
        bool inUse = true;
        int numUsed = 0;
        while (inUse) {
          inUse = false;
          for (const std::string &usedName : usedUris) {
            if (binUri.compare(usedName) != 0) continue;
            inUse = true;
            binUri = defaultBinFilename + std::to_string(numUsed++) +
                     defaultBinFileExt;
            break;
          }
        }
      }
      usedUris.push_back(binUri);
      binSavePath = JoinPath(baseDir, binUri);
      if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                               binUri)) {
        return false;
      }
    }
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfFile(filename, JsonToString(output));
  } else {
    WriteGltfFile(filename, JsonToString(output, (prettyPrint ? 2 : -1)));
  }

  return true;
}